

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O0

void __thiscall
helics::CoreApp::CoreApp(CoreApp *this,CoreType ctype,string_view coreName,int argc,char **argv)

{
  ParseOutput PVar1;
  pointer this_00;
  CoreType in_ESI;
  undefined4 in_R8D;
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  int *in_stack_00000068;
  helicsCLI11App *in_stack_00000070;
  CoreApp *in_stack_00000078;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *this_01;
  allocator<char> *in_stack_ffffffffffffffd0;
  
  std::shared_ptr<helics::Core>::shared_ptr((shared_ptr<helics::Core> *)0x464837);
  this_01 = (unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
            &stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_ESI,in_R8D),in_R9,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  generateParser(in_stack_00000078);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x46488e);
  helicsCLI11App::setDefaultCoreType(this_00,in_ESI);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x4648a6);
  PVar1 = helicsCLI11App::helics_parse<int&,char**&>
                    (in_stack_00000070,in_stack_00000068,(char ***)coreName._M_str);
  if (PVar1 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)CONCAT44(ctype,argc));
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr(this_01);
  return;
}

Assistant:

CoreApp::CoreApp(CoreType ctype, std::string_view coreName, int argc, char* argv[]): name(coreName)
{
    auto app = generateParser();
    app->setDefaultCoreType(ctype);
    if (app->helics_parse(argc, argv) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}